

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O1

stmm_table * stmm_copy(stmm_table *old_table)

{
  int iVar1;
  stmm_compare_func_type p_Var2;
  stmm_hash_func_type p_Var3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  stmm_table *__ptr;
  stmm_table_entry **ppsVar9;
  Extra_MmFixed_t *p;
  stmm_table_entry *psVar10;
  long lVar11;
  stmm_table_entry *psVar12;
  
  iVar1 = old_table->num_bins;
  __ptr = (stmm_table *)malloc(0x38);
  if (__ptr != (stmm_table *)0x0) {
    __ptr->pMemMan = old_table->pMemMan;
    p_Var2 = old_table->compare;
    p_Var3 = old_table->hash;
    iVar5 = old_table->num_bins;
    iVar6 = old_table->num_entries;
    iVar7 = old_table->max_density;
    iVar8 = old_table->reorder_flag;
    ppsVar9 = old_table->bins;
    __ptr->grow_factor = old_table->grow_factor;
    __ptr->bins = ppsVar9;
    __ptr->num_bins = iVar5;
    __ptr->num_entries = iVar6;
    __ptr->max_density = iVar7;
    __ptr->reorder_flag = iVar8;
    __ptr->compare = p_Var2;
    __ptr->hash = p_Var3;
    ppsVar9 = (stmm_table_entry **)malloc((long)iVar1 * 8);
    __ptr->bins = ppsVar9;
    if (ppsVar9 != (stmm_table_entry **)0x0) {
      p = Extra_MmFixedStart(0x18);
      __ptr->pMemMan = p;
      if (iVar1 < 1) {
        return __ptr;
      }
      lVar11 = 0;
      do {
        ppsVar9[lVar11] = (stmm_table_entry *)0x0;
        for (psVar12 = old_table->bins[lVar11]; psVar12 != (stmm_table_entry *)0x0;
            psVar12 = psVar12->next) {
          psVar10 = (stmm_table_entry *)Extra_MmFixedEntryFetch(p);
          if (psVar10 == (stmm_table_entry *)0x0) {
            Extra_MmFixedStop(p);
            free(ppsVar9);
            __ptr->bins = (stmm_table_entry **)0x0;
            goto LAB_0049d1fa;
          }
          psVar10->next = psVar12->next;
          pcVar4 = psVar12->record;
          psVar10->key = psVar12->key;
          psVar10->record = pcVar4;
          psVar10->next = ppsVar9[lVar11];
          ppsVar9[lVar11] = psVar10;
        }
        lVar11 = lVar11 + 1;
        if (lVar11 == iVar1) {
          return __ptr;
        }
      } while( true );
    }
LAB_0049d1fa:
    free(__ptr);
  }
  return (stmm_table *)0x0;
}

Assistant:

stmm_table *
stmm_copy (stmm_table *old_table)
{
    stmm_table *newEntry_table;
    stmm_table_entry *ptr, /* *newEntryptr, *next, */ *newEntry;
    int i, /*j, */ num_bins = old_table->num_bins;

    newEntry_table = ABC_ALLOC(stmm_table, 1);
    if (newEntry_table == NULL) {
    return NULL;
    }

    *newEntry_table = *old_table;
    newEntry_table->bins = ABC_ALLOC(stmm_table_entry *, num_bins);
    if (newEntry_table->bins == NULL) {
    ABC_FREE(newEntry_table);
    return NULL;
    }

    // allocate the memory manager for the newEntry table
    newEntry_table->pMemMan = Extra_MmFixedStart (sizeof (stmm_table_entry));

    for (i = 0; i < num_bins; i++) {
    newEntry_table->bins[i] = NULL;
    ptr = old_table->bins[i];
    while (ptr != NULL) {
//                      newEntry = ABC_ALLOC( stmm_table_entry, 1 );
        newEntry = (stmm_table_entry *)Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)newEntry_table->pMemMan);
        if (newEntry == NULL) {
/*
                for ( j = 0; j <= i; j++ )
                {
                    newEntryptr = newEntry_table->bins[j];
                    while ( newEntryptr != NULL )
                    {
                        next = newEntryptr->next;
                        ABC_FREE( newEntryptr );
                        newEntryptr = next;
                    }
                }
*/
        Extra_MmFixedStop ((Extra_MmFixed_t *)newEntry_table->pMemMan);

        ABC_FREE(newEntry_table->bins);
        ABC_FREE(newEntry_table);
        return NULL;
        }
        *newEntry = *ptr;
        newEntry->next = newEntry_table->bins[i];
        newEntry_table->bins[i] = newEntry;
        ptr = ptr->next;
    }
    }
    return newEntry_table;
}